

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryIOWrapper.h
# Opt level: O0

size_t __thiscall
Assimp::MemoryIOStream::Read(MemoryIOStream *this,void *pvBuffer,size_t pSize,size_t pCount)

{
  unsigned_long *puVar1;
  size_t __n;
  size_t ofs;
  unsigned_long local_30;
  size_t cnt;
  size_t pCount_local;
  size_t pSize_local;
  void *pvBuffer_local;
  MemoryIOStream *this_local;
  
  cnt = pCount;
  pCount_local = pSize;
  pSize_local = (size_t)pvBuffer;
  pvBuffer_local = this;
  if (pvBuffer == (void *)0x0) {
    __assert_fail("nullptr != pvBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/include/assimp/MemoryIOWrapper.h"
                  ,0x50,"virtual size_t Assimp::MemoryIOStream::Read(void *, size_t, size_t)");
  }
  if (pSize != 0) {
    ofs = (this->length - this->pos) / pSize;
    puVar1 = std::min<unsigned_long>(&cnt,&ofs);
    local_30 = *puVar1;
    __n = pCount_local * local_30;
    memcpy((void *)pSize_local,this->buffer + this->pos,__n);
    this->pos = __n + this->pos;
    return local_30;
  }
  __assert_fail("0 != pSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/include/assimp/MemoryIOWrapper.h"
                ,0x51,"virtual size_t Assimp::MemoryIOStream::Read(void *, size_t, size_t)");
}

Assistant:

size_t Read(void* pvBuffer, size_t pSize, size_t pCount)    {
        ai_assert(nullptr != pvBuffer);
        ai_assert(0 != pSize);
        
        const size_t cnt = std::min( pCount, (length-pos) / pSize);
        const size_t ofs = pSize * cnt;

        ::memcpy(pvBuffer,buffer+pos,ofs);
        pos += ofs;

        return cnt;
    }